

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O0

double delUVbyDelZ(double **U,double **V,int i,int j,int z,double alpha,double delz)

{
  double dVar1;
  double dVar2;
  double correctionTerm;
  double duvdz;
  double delz_local;
  double alpha_local;
  int z_local;
  int j_local;
  int i_local;
  double **V_local;
  double **U_local;
  
  dVar1 = (U[i + 1][j] + U[i + 1][j + 1]) * (V[i][j + 1] + V[i + 1][j + 1]);
  dVar2 = delz * 4.0;
  if (z == 1) {
    duvdz = -(U[i][j] + U[i][j + 1]) * (V[i + -1][j + 1] + V[i][j + 1]) + dVar1;
    if ((alpha == 0.0) && (!NAN(alpha))) {
      return duvdz / dVar2;
    }
    correctionTerm =
         -ABS(U[i][j] + U[i][j + 1]) * (V[i + -1][j + 1] - V[i][j + 1]) +
         ABS(U[i + 1][j] + U[i + 1][j + 1]) * (V[i][j + 1] - V[i + 1][j + 1]);
  }
  else {
    duvdz = -(U[i + 1][j + -1] + U[i + 1][j]) * (V[i][j] + V[i + 1][j]) + dVar1;
    if ((alpha == 0.0) && (!NAN(alpha))) {
      return duvdz / dVar2;
    }
    correctionTerm =
         -ABS(V[i][j] + V[i + 1][j]) * (U[i + 1][j + -1] - U[i + 1][j]) +
         ABS(V[i][j + 1] + V[i + 1][j + 1]) * (U[i + 1][j] - U[i + 1][j + 1]);
  }
  return (alpha * correctionTerm + duvdz) / dVar2;
}

Assistant:

REAL delUVbyDelZ (REAL **U, REAL **V, int i, int j, int z, REAL alpha, REAL delz)
{
	REAL duvdz = (U[i+1][j] + U[i+1][j+1])*(V[i][j+1] + V[i+1][j+1]);
	REAL correctionTerm = 0;
	delz *= 4;
	if (z == DERIVE_BY_X)
	{
		duvdz -= (U[i][j] + U[i][j+1])*(V[i-1][j+1] + V[i][j+1]);
		if (alpha == 0)
			return duvdz/delz;
		correctionTerm = fabs(U[i+1][j] + U[i+1][j+1]) * (V[i][j+1] - V[i+1][j+1]);
		correctionTerm -= fabs(U[i][j]+U[i][j+1]) * (V[i-1][j+1] - V[i][j+1]);
	}
	else
	{
		duvdz -= (U[i+1][j-1] + U[i+1][j])*(V[i][j] + V[i+1][j]);
		if (alpha == 0)
			return duvdz/delz;
		correctionTerm = fabs(V[i][j+1] + V[i+1][j+1]) * (U[i+1][j] - U[i+1][j+1]);
		correctionTerm -= fabs(V[i][j] + V[i+1][j]) * (U[i+1][j-1] - U[i+1][j]);
	}
	return (duvdz + alpha*correctionTerm)/delz;
}